

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.h
# Opt level: O1

bool chrono::utils::ChParserOpenSim::CStrToBool(char *string)

{
  int iVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  bool bVar3;
  string str;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  size_t local_48;
  long local_40 [2];
  long *local_30;
  size_t local_28;
  long local_20 [2];
  
  std::__cxx11::string::string((string *)&local_50,string,(allocator *)&local_30);
  local_30 = (long *)CONCAT71(local_30._1_7_,0x20);
  _Var2 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (local_50,local_50._M_current + local_48,(_Iter_equals_val<const_char>)&local_30
                    );
  local_48 = (long)_Var2._M_current - (long)local_50._M_current;
  *_Var2._M_current = '\0';
  local_30 = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"true","");
  if (local_48 == local_28) {
    if (local_48 == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp(local_50._M_current,local_30,local_48);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  if ((long *)local_50._M_current != local_40) {
    operator_delete(local_50._M_current,local_40[0] + 1);
  }
  return bVar3;
}

Assistant:

static inline bool CStrToBool(const char* string) { return stringStripCStr(string) == std::string("true"); }